

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O2

void CorUnix::InternalInitializeCriticalSectionAndSpinCount
               (PCRITICAL_SECTION pCriticalSection,DWORD dwSpinCount,bool fInternal)

{
  undefined8 *puVar1;
  BOOL BVar2;
  CPalThread *pThread;
  _CRITICAL_SECTION_DEBUG_INFO *p_Var3;
  undefined7 in_register_00000011;
  
  pCriticalSection->DebugInfo = (PVOID)0x0;
  pThread = (CPalThread *)0x0;
  pCriticalSection->LockCount = 0;
  pCriticalSection->RecursionCount = 0;
  pCriticalSection->SpinCount = (ulong)dwSpinCount;
  pCriticalSection->OwningThread = (HANDLE)0x0;
  pCriticalSection->LockSemaphore = (HANDLE)0x0;
  pCriticalSection->bInternal = (BOOL)CONCAT71(in_register_00000011,fInternal);
  BVar2 = PALIsThreadDataInitialized();
  if (BVar2 != 0) {
    pThread = GetCurrentPalThread();
  }
  p_Var3 = InternalNew<_CRITICAL_SECTION_DEBUG_INFO>();
  pCriticalSection->DebugInfo = p_Var3;
  if (p_Var3 == (_CRITICAL_SECTION_DEBUG_INFO *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalInitializeCriticalSectionAndSpinCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x280);
    fprintf(_stderr,
            "Expression: NULL != pPalCriticalSection->DebugInfo, Description: Failed to allocate debug info for new CS\n"
           );
    p_Var3 = (_CRITICAL_SECTION_DEBUG_INFO *)pCriticalSection->DebugInfo;
  }
  (p_Var3->lAcquireCount).m_val = 0;
  *(undefined4 *)((long)pCriticalSection->DebugInfo + 0x1c) = 0;
  *(undefined4 *)((long)pCriticalSection->DebugInfo + 0x20) = 0;
  *(PCRITICAL_SECTION *)((long)pCriticalSection->DebugInfo + 0x10) = pCriticalSection;
  puVar1 = g_csPALCSsListLock;
  if (pCriticalSection == (PCRITICAL_SECTION)&g_csPALCSsListLock) {
    *g_csPALCSsListLock = &g_PALCSList;
    puVar1[1] = PTR_g_PALCSList_001887a0;
    *(undefined8 **)PTR_g_PALCSList_001887a0 = puVar1;
    PTR_g_PALCSList_001887a0 = (undefined *)puVar1;
  }
  else {
    InternalEnterCriticalSection(pThread,(PCRITICAL_SECTION)&g_csPALCSsListLock);
    puVar1 = (undefined8 *)pCriticalSection->DebugInfo;
    *puVar1 = &g_PALCSList;
    puVar1[1] = PTR_g_PALCSList_001887a0;
    *(undefined8 **)PTR_g_PALCSList_001887a0 = puVar1;
    PTR_g_PALCSList_001887a0 = (undefined *)puVar1;
    InternalLeaveCriticalSection(pThread,(PCRITICAL_SECTION)&g_csPALCSsListLock);
  }
  pCriticalSection->dwInitState = 1;
  return;
}

Assistant:

void InternalInitializeCriticalSectionAndSpinCount(
        PCRITICAL_SECTION pCriticalSection,
        DWORD dwSpinCount,
        bool fInternal)
    {
        PAL_CRITICAL_SECTION * pPalCriticalSection =
            reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);

#ifndef PALCS_TRANSFER_OWNERSHIP_ON_RELEASE
        // Make sure bits are defined in a usable way
        _ASSERTE(PALCS_LOCK_AWAKENED_WAITER * 2 == PALCS_LOCK_WAITER_INC);
#endif // !PALCS_TRANSFER_OWNERSHIP_ON_RELEASE

        // Make sure structure sizes are compatible
        _ASSERTE(sizeof(CRITICAL_SECTION) >= sizeof(PAL_CRITICAL_SECTION));

#ifdef _DEBUG
        if (sizeof(CRITICAL_SECTION) > sizeof(PAL_CRITICAL_SECTION))
        {
            WARN("PAL_CS_NATIVE_DATA_SIZE appears to be defined to a value (%d) "
                 "larger than needed on this platform (%d).\n",
                 sizeof(CRITICAL_SECTION), sizeof(PAL_CRITICAL_SECTION));
        }
#endif // _DEBUG

        // Init CS data
        pPalCriticalSection->DebugInfo         = NULL;
        pPalCriticalSection->LockCount         = 0;
        pPalCriticalSection->RecursionCount    = 0;
        pPalCriticalSection->SpinCount         = dwSpinCount;
        pPalCriticalSection->OwningThread      = NULL;
        pPalCriticalSection->LockSemaphore     = NULL;
        pPalCriticalSection->fInternal         = fInternal;

#ifdef _DEBUG
        CPalThread * pThread =
            (PALIsThreadDataInitialized() ? GetCurrentPalThread() : NULL);

        pPalCriticalSection->DebugInfo = InternalNew<CRITICAL_SECTION_DEBUG_INFO>();
        _ASSERT_MSG(NULL != pPalCriticalSection->DebugInfo,
                    "Failed to allocate debug info for new CS\n");

        // Init debug info data
        pPalCriticalSection->DebugInfo->lAcquireCount    = 0;
        pPalCriticalSection->DebugInfo->lEnterCount      = 0;
        pPalCriticalSection->DebugInfo->lContentionCount = 0;
        pPalCriticalSection->DebugInfo->pOwnerCS         = pPalCriticalSection;

        // Insert debug info struct in global list
        if (pPalCriticalSection != &g_csPALCSsListLock)
        {
            InternalEnterCriticalSection(pThread,
                reinterpret_cast<CRITICAL_SECTION*>(&g_csPALCSsListLock));
            InsertTailList(&g_PALCSList, &pPalCriticalSection->DebugInfo->Link);
            InternalLeaveCriticalSection(pThread,
                reinterpret_cast<CRITICAL_SECTION*>(&g_csPALCSsListLock));
        }
        else
        {
            InsertTailList(&g_PALCSList, &pPalCriticalSection->DebugInfo->Link);
        }

#ifdef PAL_TRACK_CRITICAL_SECTIONS_DATA
        InterlockedIncrement(fInternal ?
            &g_lPALCSInternalInitializeCount : &g_lPALCSInitializeCount);
#endif // PAL_TRACK_CRITICAL_SECTIONS_DATA
#endif // _DEBUG

        // Set initializazion state
        pPalCriticalSection->cisInitState = PalCsUserInitialized;

#ifdef MUTEX_BASED_CSS
        bool fInit;
        do
        {
            fInit = PALCS_FullyInitialize(pPalCriticalSection);
            _ASSERTE(fInit);
        } while (!fInit && 0 == sched_yield());

        if (fInit)
        {
            // Set initializazion state
            pPalCriticalSection->cisInitState = PalCsFullyInitialized;
        }
#endif // MUTEX_BASED_CSS
    }